

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void absl::CopyCordToString(Cord *src,Nonnull<std::string_*> dst)

{
  if (((src->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    Cord::InlineRep::CopyTo(&src->contents_,dst);
    return;
  }
  std::__cxx11::string::resize
            ((ulong)dst,(char)((src->contents_).data_.rep_.field_0.as_tree.rep)->length);
  Cord::CopyToArraySlowPath(src,(dst->_M_dataplus)._M_p);
  return;
}

Assistant:

void CopyCordToString(const Cord& src, absl::Nonnull<std::string*> dst) {
  if (!src.contents_.is_tree()) {
    src.contents_.CopyTo(dst);
  } else {
    absl::strings_internal::STLStringResizeUninitialized(dst, src.size());
    src.CopyToArraySlowPath(&(*dst)[0]);
  }
}